

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

void __thiscall Fl_Help_View::end_selection(Fl_Help_View *this,int clipboard)

{
  Fl *pFVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  Fl FVar6;
  wchar_t wVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  Fl *this_00;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  byte *__s;
  Fl *buf;
  uint uVar14;
  long lVar15;
  byte *p;
  
  if ((selected == 0) || (current_view != this)) {
    return;
  }
  __s = (byte *)this->value_;
  sVar10 = strlen((char *)__s);
  this_00 = (Fl *)malloc((long)((int)sVar10 + 1));
  bVar5 = false;
  buf = this_00;
  uVar12 = 0;
LAB_001b6c8d:
  do {
    p = __s + 1;
    bVar3 = *__s;
    uVar14 = (uint)bVar3;
    lVar15 = 1;
    if (bVar3 == 0x26) {
      uVar14 = quote_char((char *)p);
      if ((int)uVar14 < 0) {
        uVar14 = 0x26;
      }
      else {
        lVar15 = 1;
        do {
          pbVar2 = __s + lVar15;
          lVar15 = lVar15 + 1;
          if (*pbVar2 == 0x3b) break;
        } while (*pbVar2 != 0);
      }
    }
    else {
      if (bVar3 == 0) goto LAB_001b709f;
      if (bVar3 == 0x3c) {
        iVar13 = (int)__s + 1;
        do {
          bVar3 = *p;
          if (bVar3 == 0) goto LAB_001b709f;
          p = p + 1;
          iVar13 = iVar13 + 1;
        } while (bVar3 != 0x3e);
        iVar8 = tolower((int)(char)__s[1]);
        uVar14 = iVar8 << 0x18;
        bVar3 = __s[2];
        if ((0x3e < (ulong)bVar3) || ((0x4000000100000001U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
          iVar8 = tolower((int)(char)bVar3);
          uVar14 = uVar14 | iVar8 << 0x10;
          bVar3 = __s[3];
          if (((ulong)bVar3 < 0x3f) && ((0x4000000100000001U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
          goto LAB_001b6dca;
          iVar8 = tolower((int)(char)bVar3);
          uVar14 = uVar14 | iVar8 << 8;
          bVar3 = __s[4];
          if (((ulong)bVar3 < 0x3f) && ((0x4000000100000001U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
          goto LAB_001b6dca;
          bVar4 = true;
          if (((ulong)__s[5] < 0x3f) && ((0x4000000100000001U >> ((ulong)__s[5] & 0x3f) & 1) != 0))
          {
            uVar9 = tolower((int)(char)bVar3);
            uVar14 = uVar14 | uVar9;
            goto LAB_001b6dca;
          }
          pcVar11 = (char *)0x0;
          goto LAB_001b7013;
        }
LAB_001b6dca:
        bVar4 = true;
        if ((int)uVar14 < 0x68310000) {
          if (0x2f6835ff < (int)uVar14) {
            if ((int)uVar14 < 0x62720000) {
              if (uVar14 == 0x2f683600) goto LAB_001b700a;
              if (uVar14 == 0x2f700000) goto LAB_001b6fd6;
              if (uVar14 != 0x2f707265) goto LAB_001b7083;
              pcVar11 = (char *)0x0;
              bVar5 = false;
            }
            else if (uVar14 == 0x62720000) {
LAB_001b6fd6:
              bVar4 = false;
              pcVar11 = "\n";
            }
            else if (uVar14 == 0x64640000) {
              bVar4 = false;
              pcVar11 = "\n - ";
            }
            else {
              if (uVar14 != 0x64740000) goto LAB_001b7083;
              bVar4 = false;
              pcVar11 = "\n ";
            }
            goto LAB_001b7013;
          }
          if ((int)uVar14 < 0x2f683300) {
            if ((uVar14 == 0x2f683100) || (uVar14 == 0x2f683200)) goto LAB_001b700a;
          }
          else if ((uVar14 == 0x2f683300) || ((uVar14 == 0x2f683400 || (uVar14 == 0x2f683500)))) {
LAB_001b700a:
            bVar4 = false;
            pcVar11 = "\n\n";
            goto LAB_001b7013;
          }
LAB_001b7083:
          pcVar11 = (char *)0x0;
        }
        else {
          if ((int)uVar14 < 0x68360000) {
            if ((int)uVar14 < 0x68330000) {
              if ((uVar14 == 0x68310000) || (uVar14 == 0x68320000)) goto LAB_001b700a;
            }
            else if ((uVar14 == 0x68330000) || ((uVar14 == 0x68340000 || (uVar14 == 0x68350000))))
            goto LAB_001b700a;
            goto LAB_001b7083;
          }
          if ((int)uVar14 < 0x70726500) {
            if (uVar14 == 0x68360000) goto LAB_001b700a;
            if (uVar14 != 0x6c690000) {
              if (uVar14 != 0x70000000) goto LAB_001b7083;
              goto LAB_001b6fd6;
            }
            bVar4 = false;
            pcVar11 = "\n * ";
          }
          else {
            if (uVar14 == 0x74720000) goto LAB_001b700a;
            if (uVar14 == 0x74640000) goto LAB_001b6fd6;
            pcVar11 = (char *)0x0;
            if (uVar14 == 0x70726500) {
              bVar4 = true;
              pcVar11 = (char *)0x0;
              bVar5 = true;
            }
          }
        }
LAB_001b7013:
        __s = p;
        if (((!bVar4) && (iVar13 = iVar13 - *(int *)&this->value_, selection_first < iVar13)) &&
           (iVar13 <= selection_last)) {
          FVar6 = (Fl)*pcVar11;
          while (FVar6 != (Fl)0x0) {
            *buf = FVar6;
            buf = buf + 1;
            pFVar1 = (Fl *)pcVar11 + 1;
            pcVar11 = (char *)((Fl *)pcVar11 + 1);
            FVar6 = *pFVar1;
          }
          FVar6 = ((Fl *)pcVar11)[-1];
          iVar13 = isspace((uint)(byte)FVar6);
          uVar12 = (uint)(byte)FVar6;
          if (iVar13 != 0) {
            uVar12 = 0x20;
          }
        }
        goto LAB_001b6c8d;
      }
    }
    iVar13 = (int)p - *(int *)&this->value_;
    if ((selection_first < iVar13) && (iVar13 <= selection_last)) {
      if ((!bVar5) && (((int)uVar14 < 0x100 && (iVar8 = isspace(uVar14), iVar8 != 0)))) {
        uVar14 = 0x20;
      }
      if (uVar14 == 0x20 && uVar12 == 0x20) {
        uVar12 = 0x20;
      }
      else {
        uVar12 = uVar14;
        if (lVar15 == 1) {
          *buf = SUB41(uVar14,0);
          buf = buf + 1;
        }
        else {
          wVar7 = fl_utf8encode(uVar14,(char *)buf);
          buf = buf + wVar7;
        }
      }
    }
    __s = __s + lVar15;
    if (selection_last < iVar13) {
LAB_001b709f:
      *buf = (Fl)0x0;
      sVar10 = strlen((char *)this_00);
      Fl::copy(this_00,(EVP_PKEY_CTX *)(sVar10 & 0xffffffff),(EVP_PKEY_CTX *)(ulong)(uint)clipboard)
      ;
      free(this_00);
      return;
    }
  } while( true );
}

Assistant:

void Fl_Help_View::end_selection(int clipboard)
{
  if (!selected || current_view!=this)
    return;
  // convert the select part of our html text into some kind of somewhat readable UTF-8
  // and store it in the selection buffer
  int p = 0;
  char pre = 0;
  int len = (int) strlen(value_);
  char *txt = (char*)malloc(len+1), *d = txt;
  const char *s = value_, *cmd, *src;
  for (;;) {
    int c = (*s++) & 0xff;
    if (c==0) break;
    if (c=='<') { // begin of some html command. Skip until we find a '>'
      cmd = s;
      for (;;) {
        c = (*s++) & 0xff;
        if (c==0 || c=='>') break;
      }
      if (c==0) break;
      // do something with this command... .
      // The replacement string must not be longer than the command
      // itself plus '<' and '>'
      src = 0;
      switch (command(cmd)) {
        case CMD('p','r','e', 0 ): pre = 1; break;
        case CMD('/','p','r','e'): pre = 0; break;
        case CMD('t','d', 0 , 0 ):
        case CMD('p', 0 , 0 , 0 ):
        case CMD('/','p', 0 , 0 ):
        case CMD('b','r', 0 , 0 ): src = "\n"; break;
        case CMD('l','i', 0 , 0 ): src = "\n * "; break;
        case CMD('/','h','1', 0 ):
        case CMD('/','h','2', 0 ):
        case CMD('/','h','3', 0 ):
        case CMD('/','h','4', 0 ):
        case CMD('/','h','5', 0 ):
        case CMD('/','h','6', 0 ): src = "\n\n"; break;
        case CMD('t','r', 0 , 0 ):
        case CMD('h','1', 0 , 0 ):
        case CMD('h','2', 0 , 0 ):
        case CMD('h','3', 0 , 0 ):
        case CMD('h','4', 0 , 0 ):
        case CMD('h','5', 0 , 0 ):
        case CMD('h','6', 0 , 0 ): src = "\n\n"; break;
        case CMD('d','t', 0 , 0 ): src = "\n "; break;
        case CMD('d','d', 0 , 0 ): src = "\n - "; break;
      }
      int n = (int) (s-value_);
      if (src && n>selection_first && n<=selection_last) {
        while (*src) {
          *d++ = *src++;
        }
        c = src[-1] & 0xff;
        p = isspace(c) ? ' ' : c;
      }
      continue;
    }
    const char *s2 = s;
    if (c=='&') { // special characters (HTML entities)
      int xx = quote_char(s);
      if (xx >= 0) {
        c = xx;
        for (;;) {
          char cc = *s++;
          if (!cc || cc==';') break;
        }
      }
    }
    int n = (int) (s2-value_);
    if (n>selection_first && n<=selection_last) {
      if (!pre && c < 256 && isspace(c)) c = ' ';
      if (p != ' ' || c != ' ') {
        if (s2 != s) { // c was an HTML entity
          d += fl_utf8encode(c, d);
        }
        else *d++ = c;
      }
      p = c;
    }
    if (n>selection_last) break; // stop parsing html after end of selection
  }
  *d = 0;
  Fl::copy(txt, (int) strlen(txt), clipboard);
  // printf("copy [%s]\n", txt);
  free(txt);
}